

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.cpp
# Opt level: O2

void __thiscall
TasOptimization::ParticleSwarmState::ParticleSwarmState
          (ParticleSwarmState *this,int cnum_dimensions,vector<double,_std::allocator<double>_> *pp,
          vector<double,_std::allocator<double>_> *pv)

{
  pointer pdVar1;
  pointer pdVar2;
  allocator_type local_39;
  value_type local_38;
  
  this->positions_initialized = true;
  this->velocities_initialized = true;
  this->best_positions_initialized = false;
  this->cache_initialized = false;
  this->num_dimensions = cnum_dimensions;
  pdVar1 = (pp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pdVar2 = (pp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  this->num_particles =
       (int)((ulong)((long)pdVar2 - (long)pdVar1 >> 3) / (ulong)(long)cnum_dimensions);
  (this->particle_positions).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = pdVar1;
  (this->particle_positions).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar2;
  (this->particle_positions).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (pp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (pp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pdVar1 = (pv->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  (this->particle_velocities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pv->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  (this->particle_velocities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar1;
  (this->particle_velocities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pv->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (pv->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (pv->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pv->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&this->best_particle_positions,
             (long)this->num_dimensions * ((long)this->num_particles + 1),
             (allocator_type *)&local_38);
  local_38 = 1.79769313486232e+308;
  std::vector<double,_std::allocator<double>_>::vector
            (&this->cache_particle_fvals,(long)this->num_particles,&local_38,&local_39);
  local_38 = 1.79769313486232e+308;
  std::vector<double,_std::allocator<double>_>::vector
            (&this->cache_best_particle_fvals,(long)this->num_particles + 1,&local_38,&local_39);
  local_38 = (value_type)((ulong)local_38 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->cache_particle_inside,(long)this->num_particles,(bool *)&local_38,
             (allocator_type *)&local_39);
  local_38 = (value_type)((ulong)local_38 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->cache_best_particle_inside,(long)this->num_particles + 1,(bool *)&local_38,
             (allocator_type *)&local_39);
  return;
}

Assistant:

ParticleSwarmState::ParticleSwarmState(int cnum_dimensions, std::vector<double> &&pp, std::vector<double> &&pv):
        positions_initialized(true), velocities_initialized(true), best_positions_initialized(false), cache_initialized(false),
        num_dimensions(cnum_dimensions), num_particles(pp.size() / num_dimensions),
        particle_positions(std::move(pp)), particle_velocities(std::move(pv)),
        best_particle_positions(std::vector<double>((num_particles + 1) * num_dimensions)),
        cache_particle_fvals(std::vector<double>(num_particles, std::numeric_limits<double>::max())),
        cache_best_particle_fvals(std::vector<double>(num_particles + 1, std::numeric_limits<double>::max())),
        cache_particle_inside(std::vector<bool>(num_particles, false)),
        cache_best_particle_inside(std::vector<bool>(num_particles + 1, false)) {}